

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clean.c
# Opt level: O0

Bool NestedList(TidyDocImpl *doc,Node *node,Node **pnode)

{
  Node *pNVar1;
  Node *node_00;
  Node *pNVar2;
  Node *list;
  Node *child;
  Node **pnode_local;
  Node *node_local;
  TidyDocImpl *doc_local;
  
  if ((((node == (Node *)0x0) || (node->tag == (Dict *)0x0)) || (node->tag->id != TidyTag_UL)) &&
     (((node == (Node *)0x0 || (node->tag == (Dict *)0x0)) || (node->tag->id != TidyTag_OL)))) {
    doc_local._4_4_ = no;
  }
  else {
    pNVar1 = node->content;
    if (pNVar1 == (Node *)0x0) {
      doc_local._4_4_ = no;
    }
    else if (pNVar1->next == (Node *)0x0) {
      node_00 = pNVar1->content;
      if (node_00 == (Node *)0x0) {
        doc_local._4_4_ = no;
      }
      else if (node_00->tag == node->tag) {
        if (node_00->next == (Node *)0x0) {
          *pnode = node_00;
          node_00->prev = node->prev;
          node_00->next = node->next;
          node_00->parent = node->parent;
          prvTidyFixNodeLinks(node_00);
          pNVar1->content = (Node *)0x0;
          prvTidyFreeNode(doc,pNVar1);
          node->content = (Node *)0x0;
          node->next = (Node *)0x0;
          prvTidyFreeNode(doc,node);
          if (((node_00->prev != (Node *)0x0) &&
              ((((node_00->prev != (Node *)0x0 && (node_00->prev->tag != (Dict *)0x0)) &&
                (node_00->prev->tag->id == TidyTag_UL)) ||
               (((node_00->prev != (Node *)0x0 && (node_00->prev->tag != (Dict *)0x0)) &&
                (node_00->prev->tag->id == TidyTag_OL)))))) && (node_00->prev->last != (Node *)0x0))
          {
            pNVar1 = node_00->prev;
            pNVar2 = pNVar1->last;
            pNVar1->next = node_00->next;
            prvTidyFixNodeLinks(pNVar1);
            node_00->parent = pNVar2;
            node_00->next = (Node *)0x0;
            node_00->prev = pNVar2->last;
            prvTidyFixNodeLinks(node_00);
            CleanNode(doc,node_00);
          }
          doc_local._4_4_ = yes;
        }
        else {
          doc_local._4_4_ = no;
        }
      }
      else {
        doc_local._4_4_ = no;
      }
    }
    else {
      doc_local._4_4_ = no;
    }
  }
  return doc_local._4_4_;
}

Assistant:

static Bool NestedList( TidyDocImpl* doc, Node *node, Node **pnode )
{
    Node *child, *list;

    if ( nodeIsUL(node) || nodeIsOL(node) )
    {
        child = node->content;

        if (child == NULL)
            return no;

        /* check child has no peers */

        if (child->next)
            return no;

        list = child->content;

        if (!list)
            return no;

        if (list->tag != node->tag)
            return no;

        /* check list has no peers */
        if (list->next)
            return no;

        *pnode = list;  /* Set node to resume iteration */

        /* move inner list node into position of outer node */
        list->prev = node->prev;
        list->next = node->next;
        list->parent = node->parent;
        TY_(FixNodeLinks)(list);

        /* get rid of outer ul and its li */
        child->content = NULL;
        TY_(FreeNode)( doc, child ); /* See test #427841. */
        child = NULL;
        node->content = NULL;
        node->next = NULL;
        TY_(FreeNode)( doc, node );
        node = NULL;

        /*
          If prev node was a list the chances are this node
          should be appended to that list. Word has no way of
          recognizing nested lists and just uses indents
        */

        if (list->prev)
        {
            if ( (nodeIsUL(list->prev) || nodeIsOL(list->prev))
                 && list->prev->last )
            {
                node = list;
                list = node->prev;

                child = list->last;  /* <li> */

                list->next = node->next;
                TY_(FixNodeLinks)(list);

                node->parent = child;
                node->next = NULL;
                node->prev = child->last;
                TY_(FixNodeLinks)(node);
                CleanNode( doc, node );
            }
        }

        return yes;
    }

    return no;
}